

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O0

Result __thiscall wabt::SharedValidator::OnStart(SharedValidator *this,Location *loc,Var *func_var)

{
  Index IVar1;
  Result RVar2;
  size_type sVar3;
  Var local_b0;
  Enum local_64;
  undefined1 local_60 [8];
  FuncType func_type;
  Var *func_var_local;
  Location *loc_local;
  SharedValidator *this_local;
  Result result;
  
  Result::Result((Result *)((long)&this_local + 4),Ok);
  IVar1 = this->starts_;
  this->starts_ = IVar1 + 1;
  if (IVar1 != 0) {
    func_type.results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ =
         PrintError(this,loc,"only one start function allowed");
    Result::operator|=((Result *)((long)&this_local + 4),
                       func_type.results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
  }
  FuncType::FuncType((FuncType *)local_60);
  Var::Var(&local_b0,func_var);
  local_64 = (Enum)CheckFuncIndex(this,&local_b0,(FuncType *)local_60);
  Result::operator|=((Result *)((long)&this_local + 4),(Result)local_64);
  Var::~Var(&local_b0);
  sVar3 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::size
                    ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)local_60);
  if (sVar3 != 0) {
    RVar2 = PrintError(this,loc,"start function must be nullary");
    Result::operator|=((Result *)((long)&this_local + 4),RVar2);
  }
  sVar3 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::size
                    ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)
                     &func_type.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  if (sVar3 != 0) {
    RVar2 = PrintError(this,loc,"start function must not return anything");
    Result::operator|=((Result *)((long)&this_local + 4),RVar2);
  }
  FuncType::~FuncType((FuncType *)local_60);
  return (Result)this_local._4_4_;
}

Assistant:

Result SharedValidator::OnStart(const Location& loc, Var func_var) {
  Result result = Result::Ok;
  if (starts_++ > 0) {
    result |= PrintError(loc, "only one start function allowed");
  }
  FuncType func_type;
  result |= CheckFuncIndex(func_var, &func_type);
  if (func_type.params.size() != 0) {
    result |= PrintError(loc, "start function must be nullary");
  }
  if (func_type.results.size() != 0) {
    result |= PrintError(loc, "start function must not return anything");
  }
  return result;
}